

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O1

void __thiscall
libcellml::Generator::GeneratorImpl::addInterfaceVoiStateAndVariableInfoCode(GeneratorImpl *this)

{
  Type TVar1;
  bool bVar2;
  string interfaceVoiStateAndVariableInfoCode;
  string local_a8;
  string local_88;
  undefined1 *local_68;
  long local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  string local_48;
  
  local_60 = 0;
  local_58 = 0;
  local_68 = &local_58;
  TVar1 = AnalyserModel::type((this->mModel).
                              super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
  if ((TVar1 == ODE) || (TVar1 == DAE)) {
    GeneratorProfile::interfaceVoiInfoString_abi_cxx11_
              (&local_48,
               (this->mProfile).
               super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    bVar2 = local_48._M_string_length != 0;
  }
  else {
    bVar2 = false;
  }
  if (((TVar1 == ODE) || (TVar1 == DAE)) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2)) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    GeneratorProfile::interfaceVoiInfoString_abi_cxx11_
              (&local_88,
               (this->mProfile).
               super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_88._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  TVar1 = AnalyserModel::type((this->mModel).
                              super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
  if ((TVar1 == ODE) || (TVar1 == DAE)) {
    GeneratorProfile::interfaceStateInfoString_abi_cxx11_
              (&local_88,
               (this->mProfile).
               super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    bVar2 = local_88._M_string_length != 0;
  }
  else {
    bVar2 = false;
  }
  if (((TVar1 == ODE) || (TVar1 == DAE)) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2)) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    GeneratorProfile::interfaceStateInfoString_abi_cxx11_
              (&local_a8,
               (this->mProfile).
               super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_a8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
  }
  GeneratorProfile::interfaceVariableInfoString_abi_cxx11_
            (&local_a8,
             (this->mProfile).
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (local_a8._M_string_length != 0) {
    GeneratorProfile::interfaceVariableInfoString_abi_cxx11_
              (&local_a8,
               (this->mProfile).
               super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_a8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_60 != 0) {
    std::__cxx11::string::append((char *)&this->mCode);
  }
  std::__cxx11::string::_M_append((char *)&this->mCode,(ulong)local_68);
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
  }
  return;
}

Assistant:

void Generator::GeneratorImpl::addInterfaceVoiStateAndVariableInfoCode()
{
    std::string interfaceVoiStateAndVariableInfoCode;

    if (modelHasOdes()
        && !mProfile->interfaceVoiInfoString().empty()) {
        interfaceVoiStateAndVariableInfoCode += mProfile->interfaceVoiInfoString();
    }

    if (modelHasOdes()
        && !mProfile->interfaceStateInfoString().empty()) {
        interfaceVoiStateAndVariableInfoCode += mProfile->interfaceStateInfoString();
    }

    if (!mProfile->interfaceVariableInfoString().empty()) {
        interfaceVoiStateAndVariableInfoCode += mProfile->interfaceVariableInfoString();
    }

    if (!interfaceVoiStateAndVariableInfoCode.empty()) {
        mCode += "\n";
    }

    mCode += interfaceVoiStateAndVariableInfoCode;
}